

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
RemoveElement<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator,
          SegmentBase<Memory::PreReservedVirtualAllocWrapper> *element)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar4;
  undefined4 *puVar5;
  uint *buffer;
  
  buffer = &element[-1].trailingGuardPageCount;
  pDVar4 = (DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this;
  do {
    pDVar4 = (pDVar4->
             super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
             .node;
    if (pDVar4 == (DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this)
    break;
  } while (pDVar4 != (DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
                     buffer);
  if (pDVar4 == (DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  lVar1 = *(long *)buffer;
  **(long **)&element[-1].secondaryAllocPageCount = lVar1;
  *(undefined8 *)(lVar1 + 8) = *(undefined8 *)&element[-1].secondaryAllocPageCount;
  Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>::~SegmentBase(element);
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x40);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }